

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O1

void __thiscall avro::json::JsonGenerator::doEncodeString(JsonGenerator *this,string *s)

{
  byte *pbVar1;
  uint8_t *puVar2;
  locale *plVar3;
  ctype *pcVar4;
  byte *pbVar5;
  byte c;
  byte *b;
  size_type sVar6;
  char *p;
  byte *p_00;
  
  p_00 = (byte *)(s->_M_dataplus)._M_p;
  sVar6 = s->_M_string_length;
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  pbVar1 = p_00 + sVar6;
  puVar2 = (this->out_).next_;
  (this->out_).next_ = puVar2 + 1;
  *puVar2 = '\"';
  pbVar5 = p_00;
  b = p_00;
  do {
    if (sVar6 == 0) {
      if (b != pbVar1) {
        StreamWriter::writeBytes(&this->out_,b,(long)pbVar1 - (long)b);
      }
      if ((this->out_).next_ == (this->out_).end_) {
        StreamWriter::more(&this->out_);
      }
      puVar2 = (this->out_).next_;
      (this->out_).next_ = puVar2 + 1;
      *puVar2 = '\"';
      return;
    }
    c = *p_00;
    switch(c) {
    case 8:
      c = 0x62;
      break;
    case 9:
      c = 0x74;
      break;
    case 10:
      c = 0x6e;
      break;
    case 0xb:
switchD_0019b7e4_caseD_b:
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + (ulong)c * 2) & 2) != 0) {
        if (p_00 != b) {
          StreamWriter::writeBytes(&this->out_,b,(long)pbVar5 - (long)b);
        }
        escapeCtl(this,*p_00);
        goto LAB_0019b884;
      }
      goto LAB_0019b888;
    case 0xc:
      c = 0x66;
      break;
    case 0xd:
      c = 0x72;
      break;
    default:
      if ((0x3a < c - 0x22) || ((0x400000000002001U >> ((ulong)(c - 0x22) & 0x3f) & 1) == 0))
      goto switchD_0019b7e4_caseD_b;
    }
    escape(this,c,(char *)b,(char *)p_00);
LAB_0019b884:
    b = p_00 + 1;
LAB_0019b888:
    p_00 = p_00 + 1;
    pbVar5 = pbVar5 + 1;
    sVar6 = sVar6 - 1;
  } while( true );
}

Assistant:

void doEncodeString(const std::string& s) {
        const char* b = &s[0];
        const char* e = b + s.size();
        out_.write('"');
        for (const char* p = b; p != e; p++) {
            switch (*p) {
            case '\\':
            case '"':
            case '/':
                escape(*p, b, p);
                break;
            case '\b':
                escape('b', b, p);
                break;
            case '\f':
                escape('f', b, p);
                break;
            case '\n':
                escape('n', b, p);
                break;
            case '\r':
                escape('r', b, p);
                break;
            case '\t':
                escape('t', b, p);
                break;
            default:
                if (! std::iscntrl(*p, std::locale::classic())) {
                    continue;
                }
                write(b, p);
                escapeCtl(*p);
                break;
            }
            b = p + 1;
        }
        write(b, e);
        out_.write('"');
    }